

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

ByteData256 * __thiscall
cfd::core::ConfidentialTransaction::GetWitnessOnlyHash
          (ByteData256 *__return_storage_ptr__,ConfidentialTransaction *this)

{
  pointer pCVar1;
  pointer puVar2;
  pointer pCVar3;
  pointer pBVar4;
  pointer pBVar5;
  long lVar6;
  ulong uVar7;
  ulong __n;
  pointer pBVar8;
  ConfidentialTxIn *vin;
  pointer this_00;
  pointer this_01;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> leaves;
  ByteData256 hash_out;
  ByteData256 hash_in;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_78;
  ByteData256 local_60;
  ByteData256 local_48;
  
  local_78.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = ((long)(this->vin_).
                 super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->vin_).
                 super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5) * 0x2e8ba2e8ba2e8ba3;
  lVar6 = (long)(this->vout_).
                super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->vout_).
                super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  __n = lVar6 * -0x1084210842108421;
  if (__n <= uVar7 && uVar7 + lVar6 * 0x1084210842108421 != 0) {
    __n = uVar7;
  }
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::reserve
            (&local_78,__n);
  this_00 = (this->vin_).
            super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->vin_).
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pCVar1) {
    do {
      ConfidentialTxIn::GetWitnessHash(&local_48,this_00);
      ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
      emplace_back<cfd::core::ByteData256>(&local_78,&local_48);
      if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pCVar1);
  }
  CryptoUtil::ComputeFastMerkleRoot
            (&local_48,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&local_78);
  pBVar5 = local_78.
           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pBVar4 = local_78.
           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar8 = local_78.
           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_78.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_78.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    do {
      puVar2 = (pBVar8->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2,(long)(pBVar8->data_).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar2);
      }
      pBVar8 = pBVar8 + 1;
    } while (pBVar8 != pBVar5);
    local_78.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_finish = pBVar4;
  }
  this_01 = (this->vout_).
            super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar3 = (this->vout_).
           super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != pCVar3) {
    do {
      ConfidentialTxOut::GetWitnessHash(&local_60,this_01);
      ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
      emplace_back<cfd::core::ByteData256>(&local_78,&local_60);
      if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      this_01 = this_01 + 1;
    } while (this_01 != pCVar3);
  }
  CryptoUtil::ComputeFastMerkleRoot
            (&local_60,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&local_78);
  pBVar5 = local_78.
           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pBVar4 = local_78.
           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar8 = local_78.
           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_78.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_78.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    do {
      puVar2 = (pBVar8->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2,(long)(pBVar8->data_).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar2);
      }
      pBVar8 = pBVar8 + 1;
    } while (pBVar8 != pBVar5);
    local_78.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_finish = pBVar4;
  }
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
            (&local_78,&local_48);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
            (&local_78,&local_60);
  CryptoUtil::ComputeFastMerkleRoot
            (__return_storage_ptr__,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&local_78);
  if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_78)
  ;
  return __return_storage_ptr__;
}

Assistant:

ByteData256 ConfidentialTransaction::GetWitnessOnlyHash() const {
  std::vector<ByteData256> leaves;
  leaves.reserve(std::max(vin_.size(), vout_.size()));
  for (const auto &vin : vin_) {
    leaves.push_back(vin.GetWitnessHash());
  }
  ByteData256 hash_in = CryptoUtil::ComputeFastMerkleRoot(leaves);
  leaves.clear();

  for (const auto &vout : vout_) {
    leaves.push_back(vout.GetWitnessHash());
  }
  ByteData256 hash_out = CryptoUtil::ComputeFastMerkleRoot(leaves);
  leaves.clear();

  leaves.push_back(hash_in);
  leaves.push_back(hash_out);
  return CryptoUtil::ComputeFastMerkleRoot(leaves);
}